

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRC_Bot.cpp
# Opt level: O3

void __thiscall
IRC_Bot::setCommandAccessLevels::anon_class_16_2_306f8aac::operator()
          (anon_class_16_2_306f8aac *this,Config *in_section)

{
  IRC_Bot *pIVar1;
  void *__s;
  size_t __n_00;
  pointer puVar2;
  _Head_base<0UL,_IRCCommand_*,_false> _Var3;
  char cVar4;
  int iVar5;
  int accessLevel;
  long lVar6;
  void *pvVar7;
  size_t sVar8;
  undefined8 *puVar9;
  size_type __n;
  size_t sVar10;
  char *__data;
  char *pcVar11;
  pointer puVar12;
  basic_string_view<char,_std::char_traits<char>_> in_string;
  basic_string_view<char,_std::char_traits<char>_> in_string_00;
  basic_string_view<char,_std::char_traits<char>_> in_prefix;
  basic_string_view<char,_std::char_traits<char>_> in_prefix_00;
  string_view channel;
  
  if (in_section != (Config *)0x0) {
    pIVar1 = this->this;
    lVar6 = Jupiter::Config::getSection(in_section,8,"Commands");
    if (lVar6 != 0) {
      for (puVar9 = *(undefined8 **)(lVar6 + 0x38); puVar9 != (undefined8 *)0x0;
          puVar9 = (undefined8 *)*puVar9) {
        __s = (void *)puVar9[1];
        __n_00 = puVar9[2];
        if (__n_00 == 0) {
LAB_0010b006:
          puVar2 = (pIVar1->m_commands).
                   super__Vector_base<std::unique_ptr<IRCCommand,_std::default_delete<IRCCommand>_>,_std::allocator<std::unique_ptr<IRCCommand,_std::default_delete<IRCCommand>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (puVar12 = (pIVar1->m_commands).
                         super__Vector_base<std::unique_ptr<IRCCommand,_std::default_delete<IRCCommand>_>,_std::allocator<std::unique_ptr<IRCCommand,_std::default_delete<IRCCommand>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; puVar12 != puVar2;
              puVar12 = puVar12 + 1) {
            cVar4 = Jupiter::Command::matches
                              ((puVar12->_M_t).
                               super___uniq_ptr_impl<IRCCommand,_std::default_delete<IRCCommand>_>.
                               _M_t.
                               super__Tuple_impl<0UL,_IRCCommand_*,_std::default_delete<IRCCommand>_>
                               .super__Head_base<0UL,_IRCCommand_*,_false>._M_head_impl,__n_00,__s);
            if (cVar4 != '\0') {
              _Var3._M_head_impl =
                   (puVar12->_M_t).
                   super___uniq_ptr_impl<IRCCommand,_std::default_delete<IRCCommand>_>._M_t.
                   super__Tuple_impl<0UL,_IRCCommand_*,_std::default_delete<IRCCommand>_>.
                   super__Head_base<0UL,_IRCCommand_*,_false>._M_head_impl;
              if ((_Var3._M_head_impl != (IRCCommand *)0x0) &&
                 ((this->in_command == (IRCCommand *)0x0 || (this->in_command == _Var3._M_head_impl)
                  ))) {
                iVar5 = Jupiter_strtoi_s(puVar9[5],puVar9[6],0);
                IRCCommand::setAccessLevel(_Var3._M_head_impl,iVar5);
              }
              break;
            }
          }
        }
        else {
          pvVar7 = memchr(__s,0x2e,__n_00);
          lVar6 = (long)pvVar7 - (long)__s;
          if (lVar6 == -1 || pvVar7 == (void *)0x0) goto LAB_0010b006;
          pcVar11 = (char *)((long)__s + lVar6 + 1);
          sVar10 = __n_00 - (lVar6 + 1);
          in_string._M_str = pcVar11;
          in_string._M_len = sVar10;
          in_prefix._M_str = "Type.";
          in_prefix._M_len = 5;
          sVar8 = jessilib::starts_with_lengthi<char,char>(in_string,in_prefix);
          if (sVar8 == 0) {
            in_string_00._M_str = pcVar11;
            in_string_00._M_len = sVar10;
            in_prefix_00._M_str = "Channel.";
            in_prefix_00._M_len = 8;
            sVar8 = jessilib::starts_with_lengthi<char,char>(in_string_00,in_prefix_00);
            if (sVar8 != 0) {
              puVar12 = (pIVar1->m_commands).
                        super__Vector_base<std::unique_ptr<IRCCommand,_std::default_delete<IRCCommand>_>,_std::allocator<std::unique_ptr<IRCCommand,_std::default_delete<IRCCommand>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              puVar2 = (pIVar1->m_commands).
                       super__Vector_base<std::unique_ptr<IRCCommand,_std::default_delete<IRCCommand>_>,_std::allocator<std::unique_ptr<IRCCommand,_std::default_delete<IRCCommand>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              if (puVar12 != puVar2) {
                do {
                  cVar4 = Jupiter::Command::matches
                                    ((puVar12->_M_t).
                                     super___uniq_ptr_impl<IRCCommand,_std::default_delete<IRCCommand>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_IRCCommand_*,_std::default_delete<IRCCommand>_>
                                     .super__Head_base<0UL,_IRCCommand_*,_false>._M_head_impl,lVar6,
                                     __s);
                  if (cVar4 != '\0') {
                    _Var3._M_head_impl =
                         (puVar12->_M_t).
                         super___uniq_ptr_impl<IRCCommand,_std::default_delete<IRCCommand>_>._M_t.
                         super__Tuple_impl<0UL,_IRCCommand_*,_std::default_delete<IRCCommand>_>.
                         super__Head_base<0UL,_IRCCommand_*,_false>._M_head_impl;
                    if ((_Var3._M_head_impl != (IRCCommand *)0x0) &&
                       ((this->in_command == (IRCCommand *)0x0 ||
                        (this->in_command == _Var3._M_head_impl)))) {
                      iVar5 = Jupiter_strtoi_s(puVar9[5],puVar9[6],0);
                      channel._M_str = (char *)((long)__s + lVar6 + 9);
                      channel._M_len = sVar10 - 8;
                      IRCCommand::setAccessLevel(_Var3._M_head_impl,channel,iVar5);
                    }
                    break;
                  }
                  puVar12 = puVar12 + 1;
                } while (puVar12 != puVar2);
              }
            }
          }
          else {
            puVar12 = (pIVar1->m_commands).
                      super__Vector_base<std::unique_ptr<IRCCommand,_std::default_delete<IRCCommand>_>,_std::allocator<std::unique_ptr<IRCCommand,_std::default_delete<IRCCommand>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            puVar2 = (pIVar1->m_commands).
                     super__Vector_base<std::unique_ptr<IRCCommand,_std::default_delete<IRCCommand>_>,_std::allocator<std::unique_ptr<IRCCommand,_std::default_delete<IRCCommand>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            if (puVar12 != puVar2) {
              do {
                cVar4 = Jupiter::Command::matches
                                  ((puVar12->_M_t).
                                   super___uniq_ptr_impl<IRCCommand,_std::default_delete<IRCCommand>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_IRCCommand_*,_std::default_delete<IRCCommand>_>
                                   .super__Head_base<0UL,_IRCCommand_*,_false>._M_head_impl,lVar6,
                                   __s);
                if (cVar4 != '\0') {
                  _Var3._M_head_impl =
                       (puVar12->_M_t).
                       super___uniq_ptr_impl<IRCCommand,_std::default_delete<IRCCommand>_>._M_t.
                       super__Tuple_impl<0UL,_IRCCommand_*,_std::default_delete<IRCCommand>_>.
                       super__Head_base<0UL,_IRCCommand_*,_false>._M_head_impl;
                  if ((_Var3._M_head_impl != (IRCCommand *)0x0) &&
                     ((this->in_command == (IRCCommand *)0x0 ||
                      (this->in_command == _Var3._M_head_impl)))) {
                    iVar5 = Jupiter_strtoi_s((long)__s + lVar6 + 6,sVar10 - 5,0);
                    accessLevel = Jupiter_strtoi_s(puVar9[5],puVar9[6],0);
                    IRCCommand::setAccessLevel(_Var3._M_head_impl,iVar5,accessLevel);
                  }
                  break;
                }
                puVar12 = puVar12 + 1;
              } while (puVar12 != puVar2);
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void IRC_Bot::setCommandAccessLevels(IRCCommand *in_command) {
	auto set_command_access_levels = [this, in_command](Jupiter::Config *in_section) {
		if (in_section == nullptr) {
			return;
		}

		Jupiter::Config *section = in_section->getSection("Commands"sv);
		if (section == nullptr) {
			return;
		}

		for (auto& entry : section->getTable()) {
			size_t tmp_index;
			std::string_view tmp_key, tmp_sub_key;
			IRCCommand *command;

			tmp_index = entry.first.find('.');
			if (tmp_index != std::string_view::npos) {
				// non-default access assignment

				tmp_key = std::string_view(entry.first.data(), tmp_index);

				tmp_sub_key = entry.first;
				tmp_sub_key.remove_prefix(tmp_index + 1);

				if (jessilib::starts_withi(tmp_sub_key, "Type."sv)) {
					tmp_sub_key.remove_prefix(5); // strip "Type."

					command = this->getCommand(tmp_key);
					if (command != nullptr && (in_command == nullptr || in_command == command)) {
						command->setAccessLevel(Jupiter::from_string<int>(tmp_sub_key), Jupiter::from_string<int>(entry.second));
					}
				}
				else if (jessilib::starts_withi(tmp_sub_key, "Channel."sv)) {
					tmp_sub_key.remove_prefix(8); // strip "Channel."

					// Assign access level to command (if command exists)
					command = this->getCommand(tmp_key);
					if (command != nullptr && (in_command == nullptr || in_command == command))
						command->setAccessLevel(tmp_sub_key, Jupiter::from_string<int>(entry.second));
				}
			}
			else {
				// Assign access level to command (if command exists)
				command = this->getCommand(entry.first);
				if (command != nullptr && (in_command == nullptr || in_command == command))
					command->setAccessLevel(Jupiter::from_string<int>(entry.second));
			}
		};
	};

	set_command_access_levels(getSecondaryConfigSection());
	set_command_access_levels(getPrimaryConfigSection());
}